

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O2

string * prepareEvalExpr(string *__return_storage_ptr__,string *eval)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  string newString;
  long local_50 [4];
  
  if (eval->_M_string_length == 0) {
LAB_00143752:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)eval);
  }
  else {
    pcVar2 = (eval->_M_dataplus)._M_p;
    uVar4 = eval->_M_string_length & 0xffffffff;
    do {
      do {
        uVar4 = uVar4 - 1;
        if ((int)(uint)uVar4 < 0) goto LAB_00143752;
        uVar5 = (ulong)((uint)uVar4 & 0x7fffffff);
        cVar1 = pcVar2[uVar5];
      } while (cVar1 < '\x01');
      iVar3 = isalnum((int)cVar1);
    } while (cVar1 != ':' || iVar3 != 0);
    std::__cxx11::string::string((string *)local_50,(string *)eval);
    *(undefined1 *)(local_50[0] + uVar5) = 0x2e;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)eval);
    std::__cxx11::string::~string((string *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string prepareEvalExpr(const std::string& eval)
{
	if (eval.empty())
	{
		return eval;
	}

	int lastIndex = static_cast<int>(eval.size() - 1);

	for (int i = lastIndex; i >= 0; i--)
	{
		auto ch = eval[i];
		if (ch > 0)
		{
			if (!isalnum(ch) && ch != '_')
			{
				if (ch == ':')
				{
					auto newString = eval;
					newString[i] = '.';
					return eval;
				}
			}
		}
	}
	return eval;
}